

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::ModelExtractor::extractModel<Person>(ModelExtractor *this,shared_connection *_con)

{
  Person *obj;
  Person *bean;
  Person *local_68;
  shared_res<hiberlite::autoclosed_con> local_60;
  bean_key local_50;
  bean_key local_38;
  
  access::construct<hiberlite::ModelExtractor,Person>(this,&local_68);
  local_60._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
  local_60.res = _con->res;
  if (local_60.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_60.res)->refCount = (local_60.res)->refCount + 2;
  }
  local_38.con._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
  local_38.id = -1;
  local_38.con.res = local_60.res;
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_60);
  obj = local_68;
  bean_key::bean_key(&local_50,&local_38);
  AVisitor<hiberlite::ExtractModel>::startWalk<Person>
            (&this->super_AVisitor<hiberlite::ExtractModel>,obj,&local_50);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_50.con);
  access::destroy<hiberlite::ModelExtractor,Person>(this,local_68);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_38.con);
  return;
}

Assistant:

void ModelExtractor::extractModel(shared_connection _con)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	bean_key key(_con, Database::NULL_ID);
	startWalk(*bean, key);
	destroy(*this, bean, static_cast<unsigned int>(0));
}